

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O2

data_elem * pfx_table_find_elem(node_data *data,pfx_record *record,uint *index)

{
  long lVar1;
  data_elem *pdVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  uVar3 = 0;
  do {
    if (data->len == uVar3) {
      pdVar2 = (data_elem *)0x0;
LAB_00107833:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return pdVar2;
      }
      __stack_chk_fail();
    }
    pdVar2 = data->ary;
    if (((*(uint32_t *)((long)&pdVar2->asn + lVar4) == record->asn) &&
        ((&pdVar2->max_len)[lVar4] == record->max_len)) &&
       (*(rtr_socket **)((long)&pdVar2->socket + lVar4) == record->socket)) {
      pdVar2 = (data_elem *)((long)&pdVar2->asn + lVar4);
      if (index != (uint *)0x0) {
        *index = (uint)uVar3;
      }
      goto LAB_00107833;
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

struct data_elem *pfx_table_find_elem(const struct node_data *data, const struct pfx_record *record,
				      unsigned int *index)
{
	for (unsigned int i = 0; i < data->len; i++) {
		if (data->ary[i].asn == record->asn && data->ary[i].max_len == record->max_len &&
		    data->ary[i].socket == record->socket) {
			if (index)
				*index = i;
			return &(data->ary[i]);
		}
	}
	return NULL;
}